

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

TermList ApplicativeHelper::getHead(Term *t)

{
  bool bVar1;
  
  bVar1 = Kernel::Term::isApplication(t);
  if (bVar1) {
    do {
      t = (Term *)t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) - 2]._content;
      if (((ulong)t & 3) != 0) {
        return (TermList)(uint64_t)t;
      }
      if (0xfffffff8 < t->_functor) {
        return (TermList)(uint64_t)t;
      }
      bVar1 = Kernel::Term::isApplication(t);
    } while (bVar1);
  }
  return (TermList)(uint64_t)t;
}

Assistant:

TermList ApplicativeHelper::getHead(Term* t)
{
  TermList trm = TermList(t);
  while(t->isApplication()){
    trm = *t->nthArgument(2);
    if(!trm.isTerm() || trm.term()->isSpecial()){ break; }
    t = trm.term(); 
  }
  return trm;
}